

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int server_collected_extensions
              (ptls_t *tls,ptls_handshake_properties_t *properties,ptls_raw_extension_t *slots)

{
  ushort uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  void *pvVar4;
  uint8_t *puVar5;
  int iVar6;
  quicly_cid_t *pqVar7;
  ulong uVar8;
  undefined2 uVar9;
  quicly_cid_t *pqVar10;
  quicly_cid_t *retry_scid;
  void *stateless_reset_token;
  bool bVar11;
  quicly_cid_t initial_scid;
  
  if (slots->type == 0xffa5) {
    if (slots[1].type != 0xffff) {
      __assert_fail("slots[1].type == UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x8fb,
                    "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    puVar2 = (slots->data).base;
    pqVar7 = (quicly_cid_t *)0x0;
    bVar11 = *(uint *)((long)&properties[-8].field_0 + 0x58) < 0xff00001c;
    if (bVar11) {
      pqVar7 = &_tp_cid_ignore;
    }
    pqVar10 = &initial_scid;
    if (bVar11) {
      pqVar10 = &_tp_cid_ignore;
    }
    iVar6 = quicly_decode_transport_parameter_list
                      ((quicly_transport_parameters_t *)
                       &properties[-0xd].field_0.server.cookie.additional_data.len,pqVar7,pqVar10,
                       pqVar7,(void *)0x0,puVar2,puVar2 + (slots->data).len,
                       (uint)(*(long *)((long)properties[-0x12].field_0.server.cookie.key + 0x68) !=
                             -1));
    if (iVar6 == 0) {
      if (0xff00001b < *(uint *)((long)&properties[-8].field_0 + 0x58)) {
        if (*(uint8_t *)((long)&properties[-0xf].field_0 + 0x54) != initial_scid.len) {
          return 0x2000a;
        }
        iVar6 = bcmp((void *)((long)&properties[-0xf].field_0 + 0x40),&initial_scid,
                     (ulong)initial_scid.len);
        if (iVar6 != 0) {
          return 0x2000a;
        }
      }
      ack_frequency_set_next_update_at((quicly_conn_t *)&properties[-0x12].field_0.server.cookie);
      if (properties[-8].collected_extensions ==
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0) {
        __assert_fail("conn->initial != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                      ,0x910,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      uVar1 = *(ushort *)(properties[-8].collected_extensions + 0x68);
      if (*(ushort *)((long)&properties[-5].field_0 + 0x30) < uVar1) {
        puVar2 = properties[-0xc].field_0.client.session_ticket.base;
        uVar8 = (ulong)puVar2 & 0xffffffff;
        if ((uint8_t *)(ulong)uVar1 <= puVar2) {
          uVar8 = (ulong)uVar1;
        }
        uVar3 = *(ulong *)((long)properties[-0x12].field_0.server.cookie.key + 0x58);
        uVar9 = (undefined2)uVar3;
        if ((uVar8 & 0xffff) <= uVar3) {
          uVar9 = (undefined2)uVar8;
        }
        *(undefined2 *)((long)&properties[-5].field_0 + 0x30) = uVar9;
      }
      if (properties->additional_extensions != (ptls_raw_extension_t *)0x0) {
        __assert_fail("properties->additional_extensions == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                      ,0x91b,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      properties[1].field_0.client.esni_keys.base = "";
      properties[1].field_0.client.esni_keys.len = 0;
      *(undefined8 *)((long)&properties[1].field_0 + 0x40) = 0;
      *(undefined4 *)((long)&properties[1].field_0 + 0x48) = 0;
      if (properties[-0x12].collect_extension !=
          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0) {
        __assert_fail("conn->super.local.cid_set.cids[0].sequence == 0 && \"make sure that local_cid is in expected state before sending SRT\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                      ,0x91d,
                      "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                     );
      }
      pvVar4 = properties[-0x12].field_0.server.cookie.key;
      if (*(uint *)((long)&properties[-8].field_0 + 0x58) < 0xff00001c) {
        pqVar10 = (quicly_cid_t *)0x0;
        pqVar7 = (quicly_cid_t *)&properties[-0xc].field_0.server.cookie.additional_data;
        if (*(char *)((long)&properties[1].collect_extension + 4) == -1) {
          pqVar7 = pqVar10;
        }
        retry_scid = (quicly_cid_t *)0x0;
      }
      else {
        pqVar7 = (quicly_cid_t *)&properties[-0xc].field_0.server.cookie.additional_data;
        pqVar10 = (quicly_cid_t *)&properties[-0x12].collected_extensions;
        retry_scid = (quicly_cid_t *)0x0;
        if (*(char *)((long)&properties[1].collect_extension + 4) != -1) {
          retry_scid = (quicly_cid_t *)((long)&properties[1].field_0 + 0x60);
        }
      }
      stateless_reset_token = (void *)((long)&properties[-0x11].field_0 + 0xd);
      if (*(long *)((long)pvVar4 + 0xa8) == 0) {
        stateless_reset_token = (void *)0x0;
      }
      iVar6 = quicly_encode_transport_parameter_list
                        ((ptls_buffer_t *)&properties[1].field_0.client.esni_keys,
                         (quicly_transport_parameters_t *)((long)pvVar4 + 0x20),pqVar7,pqVar10,
                         retry_scid,stateless_reset_token,0);
      if (iVar6 == 0) {
        puVar2 = properties[1].field_0.client.esni_keys.base;
        puVar5 = *(uint8_t **)((long)&properties[1].field_0 + 0x40);
        *(undefined2 *)&properties[1].field_0 = 0xffa5;
        properties[1].field_0.client.negotiated_protocols.count = (size_t)puVar2;
        properties[1].field_0.client.session_ticket.base = puVar5;
        *(undefined2 *)((long)&properties[1].field_0 + 0x18) = 0xffff;
        *(undefined8 *)((long)&properties[1].field_0.client.session_ticket.len + 2) = 0;
        *(undefined8 *)((long)&properties[1].field_0.client.max_early_data_size + 2) = 0;
        *(undefined8 *)((long)&properties[1].field_0 + 0x28) = 0;
        properties->additional_extensions = (ptls_raw_extension_t *)(properties + 1);
        iVar6 = 0;
      }
    }
  }
  else {
    iVar6 = 0x6d;
    if (slots->type != 0xffff) {
      __assert_fail("slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x8fa,
                    "int server_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
  }
  return iVar6;
}

Assistant:

static int server_collected_extensions(ptls_t *tls, ptls_handshake_properties_t *properties, ptls_raw_extension_t *slots)
{
    quicly_conn_t *conn = (void *)((char *)properties - offsetof(quicly_conn_t, crypto.handshake_properties));
    quicly_cid_t initial_scid;
    int ret;

    if (slots[0].type == UINT16_MAX) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }
    assert(slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS);
    assert(slots[1].type == UINT16_MAX);

    { /* decode transport_parameters extension */
        const uint8_t *src = slots[0].data.base, *end = src + slots[0].data.len;
        if ((ret = quicly_decode_transport_parameter_list(
                 &conn->super.remote.transport_params, needs_cid_auth(conn) ? NULL : &tp_cid_ignore,
                 needs_cid_auth(conn) ? &initial_scid : &tp_cid_ignore, needs_cid_auth(conn) ? NULL : &tp_cid_ignore, NULL, src,
                 end, recognize_delayed_ack(conn))) != 0)
            goto Exit;
        if (needs_cid_auth(conn) &&
            !quicly_cid_is_equal(&conn->super.remote.cid_set.cids[0].cid, ptls_iovec_init(initial_scid.cid, initial_scid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            goto Exit;
        }
    }

    /* setup ack frequency */
    ack_frequency_set_next_update_at(conn);

    /* update UDP max payload size to:
     * max(current, min(max_the_remote_sent, remote.tp.max_udp_payload_size, local.tp.max_udp_payload_size)) */
    assert(conn->initial != NULL);
    if (conn->egress.max_udp_payload_size < conn->initial->largest_ingress_udp_payload_size) {
        uint16_t size = conn->initial->largest_ingress_udp_payload_size;
        if (size > conn->super.remote.transport_params.max_udp_payload_size)
            size = conn->super.remote.transport_params.max_udp_payload_size;
        if (size > conn->super.ctx->transport_params.max_udp_payload_size)
            size = conn->super.ctx->transport_params.max_udp_payload_size;
        conn->egress.max_udp_payload_size = size;
    }

    /* set transport_parameters extension to be sent in EE */
    assert(properties->additional_extensions == NULL);
    ptls_buffer_init(&conn->crypto.transport_params.buf, "", 0);
    assert(conn->super.local.cid_set.cids[0].sequence == 0 && "make sure that local_cid is in expected state before sending SRT");
    if ((ret = quicly_encode_transport_parameter_list(
             &conn->crypto.transport_params.buf, &conn->super.ctx->transport_params,
             needs_cid_auth(conn) || is_retry(conn) ? &conn->super.original_dcid : NULL,
             needs_cid_auth(conn) ? &conn->super.local.cid_set.cids[0].cid : NULL,
             needs_cid_auth(conn) && is_retry(conn) ? &conn->retry_scid : NULL,
             conn->super.ctx->cid_encryptor != NULL ? conn->super.local.cid_set.cids[0].stateless_reset_token : NULL, 0)) != 0)
        goto Exit;
    properties->additional_extensions = conn->crypto.transport_params.ext;
    conn->crypto.transport_params.ext[0] =
        (ptls_raw_extension_t){QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS,
                               {conn->crypto.transport_params.buf.base, conn->crypto.transport_params.buf.off}};
    conn->crypto.transport_params.ext[1] = (ptls_raw_extension_t){UINT16_MAX};
    conn->crypto.handshake_properties.additional_extensions = conn->crypto.transport_params.ext;

    ret = 0;

Exit:
    return ret;
}